

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *pNtkBase,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  int i;
  long lVar5;
  
  if (pNtkBase->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1d3,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1d4,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->nBarBufs != pNtkBase->nObjCounts[8]) {
    __assert_fail("pNtkBase->nBarBufs == Abc_NtkLatchNum(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1d5,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtkBase,ABC_NTK_LOGIC,pNtk->ntkFunc);
  for (iVar4 = 0; iVar4 < pNtk->vPis->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,iVar4);
    pAVar3 = Abc_NtkPi(pNtk_00,iVar4);
    (pAVar2->field_6).pCopy = pAVar3;
  }
  iVar4 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar2 = Abc_NtkObj(pNtk,i);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      iVar1 = Abc_ObjIsBarBuf(pAVar2);
      if (iVar1 == 0) {
        Abc_NtkDupObj(pNtk_00,pAVar2,1);
        for (lVar5 = 0; lVar5 < (pAVar2->vFanins).nSize; lVar5 = lVar5 + 1) {
          Abc_ObjAddFanin((pAVar2->field_6).pCopy,
                          *(Abc_Obj_t **)
                           ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar5]] +
                           0x40));
        }
      }
      else {
        pAVar3 = Abc_NtkBox(pNtk_00,iVar4);
        Abc_ObjAddFanin((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],
                        *(Abc_Obj_t **)
                         ((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray] + 0x40));
        pAVar2->field_6 =
             *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
              (pAVar3->pNtk->vObjs->pArray + *(pAVar3->vFanouts).pArray);
        iVar4 = iVar4 + 1;
      }
    }
  }
  if (iVar4 == pNtkBase->nBarBufs) {
    for (iVar4 = 0; iVar4 < pNtk->vPos->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,iVar4);
      pAVar3 = Abc_NtkPo(pNtk_00,iVar4);
      Abc_ObjAddFanin(pAVar3,*(Abc_Obj_t **)
                              ((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray] + 0x40))
      ;
    }
    return pNtk_00;
  }
  __assert_fail("nBarBufs == pNtkBase->nBarBufs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                ,0x1ec,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkBarBufsFromBuffers( Abc_Ntk_t * pNtkBase, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin, * pLatch;
    int i, k, nBarBufs;
    assert( Abc_NtkIsLogic(pNtkBase) );
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtkBase->nBarBufs == Abc_NtkLatchNum(pNtkBase) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtkBase, pNtk->ntkType, pNtk->ntkFunc );
    // transfer PI pointers
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPi(pNtkNew, i);
    // assuming that the order/number of barbufs remains the same
    nBarBufs = 0;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjIsBarBuf(pObj) )
        {
            pLatch = Abc_NtkBox(pNtkNew, nBarBufs++);
            Abc_ObjAddFanin( Abc_ObjFanin0(pLatch), Abc_ObjFanin0(pObj)->pCopy );
            pObj->pCopy = Abc_ObjFanout0(pLatch);
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    assert( nBarBufs == pNtkBase->nBarBufs );
    // connect POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAddFanin( Abc_NtkPo(pNtkNew, i), Abc_ObjFanin0(pObj)->pCopy );
    return pNtkNew;
}